

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

int get_txfm_rd_gate_level
              (int is_masked_compound_enabled,int *txfm_rd_gate_level,BLOCK_SIZE bsize,
              TX_SEARCH_CASE tx_search_case,int eval_motion_mode)

{
  int eval_motion_mode_local;
  TX_SEARCH_CASE tx_search_case_local;
  BLOCK_SIZE bsize_local;
  int *txfm_rd_gate_level_local;
  int is_masked_compound_enabled_local;
  int local_4;
  
  if (((tx_search_case == '\x01') && (eval_motion_mode == 0)) &&
     (8 < "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize])) {
    local_4 = txfm_rd_gate_level[1];
  }
  else if ((tx_search_case == '\x02') && (is_masked_compound_enabled != 0)) {
    local_4 = txfm_rd_gate_level[2];
  }
  else {
    local_4 = *txfm_rd_gate_level;
  }
  return local_4;
}

Assistant:

static inline int get_txfm_rd_gate_level(
    const int is_masked_compound_enabled,
    const int txfm_rd_gate_level[TX_SEARCH_CASES], BLOCK_SIZE bsize,
    TX_SEARCH_CASE tx_search_case, int eval_motion_mode) {
  assert(tx_search_case < TX_SEARCH_CASES);
  if (tx_search_case == TX_SEARCH_MOTION_MODE && !eval_motion_mode &&
      num_pels_log2_lookup[bsize] > 8)
    return txfm_rd_gate_level[TX_SEARCH_MOTION_MODE];
  // Enable aggressive gating of transform search only when masked compound type
  // is enabled.
  else if (tx_search_case == TX_SEARCH_COMP_TYPE_MODE &&
           is_masked_compound_enabled)
    return txfm_rd_gate_level[TX_SEARCH_COMP_TYPE_MODE];

  return txfm_rd_gate_level[TX_SEARCH_DEFAULT];
}